

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O0

int archive_write_ar_header(archive_write *a,archive_entry *entry)

{
  ulong *puVar1;
  int iVar2;
  mode_t mVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  archive_entry *in_RSI;
  archive_write *in_RDI;
  int64_t size;
  char *filename;
  char *pathname;
  ar_w *ar;
  char *se;
  char *ss;
  char buff [60];
  int append_fn;
  int ret;
  archive_entry *in_stack_ffffffffffffff18;
  archive_write *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  ulong local_98;
  char *local_90;
  char local_68 [58];
  char acStack_2e [14];
  int iVar8;
  int local_4;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  iVar8 = 0;
  puVar1 = (ulong *)in_RDI->format_data;
  *(undefined4 *)(puVar1 + 2) = 0;
  local_90 = (char *)0x0;
  local_98 = archive_entry_size(in_RSI);
  pcVar5 = archive_entry_pathname(in_stack_ffffffffffffff18);
  if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
    archive_set_error(&in_RDI->archive,0x16,"Invalid filename");
    return -0x14;
  }
  if ((char)puVar1[3] == '\0') {
    __archive_write_output(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0x297553);
    *(undefined1 *)(puVar1 + 3) = 1;
  }
  memset(local_68,0x20,0x3c);
  strncpy(acStack_2e,"`\n",2);
  iVar2 = strcmp(pcVar5,"/");
  if (iVar2 == 0) {
    local_68[0] = '/';
  }
  else {
    iVar2 = strcmp(pcVar5,"__.SYMDEF");
    if (iVar2 == 0) {
      strncpy(local_68,"__.SYMDEF",9);
    }
    else {
      iVar2 = strcmp(pcVar5,"//");
      if (iVar2 == 0) {
        *(undefined4 *)(puVar1 + 2) = 1;
        local_68[1] = 0x2f;
        local_68[0] = '/';
        goto LAB_00297b23;
      }
      local_90 = ar_basename(in_stack_ffffffffffffff38);
      if (local_90 == (char *)0x0) {
        archive_set_error(&in_RDI->archive,0x16,"Invalid filename");
        return -0x14;
      }
      if ((in_RDI->archive).archive_format == 0x70001) {
        sVar7 = strlen(local_90);
        if (sVar7 < 0x10) {
          sVar7 = strlen(local_90);
          strncpy(local_68,local_90,sVar7);
          sVar7 = strlen(local_90);
          local_68[sVar7] = '/';
        }
        else {
          if (*(int *)((long)puVar1 + 0x14) < 1) {
            archive_set_error(&in_RDI->archive,0x16,"Can\'t find string table");
            return -0x14;
          }
          sVar7 = strlen(local_90);
          pcVar5 = (char *)malloc(sVar7 + 3);
          if (pcVar5 == (char *)0x0) {
            archive_set_error(&in_RDI->archive,0xc,"Can\'t allocate filename buffer");
            return -0x1e;
          }
          sVar7 = strlen(local_90);
          strncpy(pcVar5,local_90,sVar7);
          sVar7 = strlen(local_90);
          strcpy(pcVar5 + sVar7,"/\n");
          pcVar6 = strstr((char *)puVar1[4],pcVar5);
          free(pcVar5);
          if (pcVar6 == (char *)0x0) {
            archive_set_error(&in_RDI->archive,0x16,"Invalid string table");
            return -0x14;
          }
          local_68[0] = '/';
          iVar2 = format_decimal((int64_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,iVar4)
          ;
          if (iVar2 != 0) {
            archive_set_error(&in_RDI->archive,0x22,"string table offset too large");
            return -0x14;
          }
        }
      }
      else if ((in_RDI->archive).archive_format == 0x70002) {
        sVar7 = strlen(local_90);
        if ((sVar7 < 0x11) && (pcVar5 = strchr(local_90,0x20), pcVar5 == (char *)0x0)) {
          in_stack_ffffffffffffff30 = local_68;
          in_stack_ffffffffffffff38 = local_90;
          sVar7 = strlen(local_90);
          strncpy(in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,sVar7);
          sVar7 = strlen(local_90);
          local_68[sVar7] = ' ';
        }
        else {
          strncpy(local_68,"#1/",3);
          strlen(local_90);
          iVar8 = format_decimal((int64_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,iVar4)
          ;
          if (iVar8 != 0) {
            archive_set_error(&in_RDI->archive,0x22,"File name too long");
            return -0x14;
          }
          iVar8 = 1;
          sVar7 = strlen(local_90);
          local_98 = sVar7 + local_98;
        }
      }
    }
  }
  archive_entry_mtime(in_RSI);
  iVar2 = format_decimal((int64_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,iVar4);
  if (iVar2 != 0) {
    archive_set_error(&in_RDI->archive,0x22,"File modification time too large");
    return -0x14;
  }
  archive_entry_uid(in_RSI);
  iVar2 = format_decimal((int64_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,iVar4);
  if (iVar2 != 0) {
    archive_set_error(&in_RDI->archive,0x22,"Numeric user ID too large");
    return -0x14;
  }
  archive_entry_gid(in_RSI);
  iVar2 = format_decimal((int64_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,iVar4);
  if (iVar2 != 0) {
    archive_set_error(&in_RDI->archive,0x22,"Numeric group ID too large");
    return -0x14;
  }
  archive_entry_mode(in_RSI);
  iVar2 = format_octal((int64_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,iVar4);
  if (iVar2 != 0) {
    archive_set_error(&in_RDI->archive,0x22,"Numeric mode too large");
    return -0x14;
  }
  if ((local_90 != (char *)0x0) && (mVar3 = archive_entry_filetype(in_RSI), mVar3 != 0x8000)) {
    archive_set_error(&in_RDI->archive,0x16,"Regular file required for non-pseudo member");
    return -0x14;
  }
LAB_00297b23:
  iVar4 = format_decimal((int64_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,iVar4);
  if (iVar4 == 0) {
    local_4 = __archive_write_output(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0x297b88);
    if (local_4 == 0) {
      *puVar1 = local_98;
      puVar1[1] = *puVar1 & 1;
      if (0 < iVar8) {
        strlen(local_90);
        iVar4 = __archive_write_output(in_RDI,in_stack_ffffffffffffff18,0x297c0b);
        if (iVar4 != 0) {
          return iVar4;
        }
        sVar7 = strlen(local_90);
        *puVar1 = *puVar1 - sVar7;
      }
      local_4 = 0;
    }
  }
  else {
    archive_set_error(&in_RDI->archive,0x22,"File size out of range");
    local_4 = -0x14;
  }
  return local_4;
}

Assistant:

static int
archive_write_ar_header(struct archive_write *a, struct archive_entry *entry)
{
	int ret, append_fn;
	char buff[60];
	char *ss, *se;
	struct ar_w *ar;
	const char *pathname;
	const char *filename;
	int64_t size;

	append_fn = 0;
	ar = (struct ar_w *)a->format_data;
	ar->is_strtab = 0;
	filename = NULL;
	size = archive_entry_size(entry);


	/*
	 * Reject files with empty name.
	 */
	pathname = archive_entry_pathname(entry);
	if (pathname == NULL || *pathname == '\0') {
		archive_set_error(&a->archive, EINVAL,
		    "Invalid filename");
		return (ARCHIVE_WARN);
	}

	/*
	 * If we are now at the beginning of the archive,
	 * we need first write the ar global header.
	 */
	if (!ar->wrote_global_header) {
		__archive_write_output(a, "!<arch>\n", 8);
		ar->wrote_global_header = 1;
	}

	memset(buff, ' ', 60);
	strncpy(&buff[AR_fmag_offset], "`\n", 2);

	if (strcmp(pathname, "/") == 0 ) {
		/* Entry is archive symbol table in GNU format */
		buff[AR_name_offset] = '/';
		goto stat;
	}
	if (strcmp(pathname, "__.SYMDEF") == 0) {
		/* Entry is archive symbol table in BSD format */
		strncpy(buff + AR_name_offset, "__.SYMDEF", 9);
		goto stat;
	}
	if (strcmp(pathname, "//") == 0) {
		/*
		 * Entry is archive filename table, inform that we should
		 * collect strtab in next _data call.
		 */
		ar->is_strtab = 1;
		buff[AR_name_offset] = buff[AR_name_offset + 1] = '/';
		/*
		 * For archive string table, only ar_size field should
		 * be set.
		 */
		goto size;
	}

	/*
	 * Otherwise, entry is a normal archive member.
	 * Strip leading paths from filenames, if any.
	 */
	if ((filename = ar_basename(pathname)) == NULL) {
		/* Reject filenames with trailing "/" */
		archive_set_error(&a->archive, EINVAL,
		    "Invalid filename");
		return (ARCHIVE_WARN);
	}

	if (a->archive.archive_format == ARCHIVE_FORMAT_AR_GNU) {
		/*
		 * SVR4/GNU variant use a "/" to mark then end of the filename,
		 * make it possible to have embedded spaces in the filename.
		 * So, the longest filename here (without extension) is
		 * actually 15 bytes.
		 */
		if (strlen(filename) <= 15) {
			strncpy(&buff[AR_name_offset], 
			    filename, strlen(filename));
			buff[AR_name_offset + strlen(filename)] = '/';
		} else {
			/*
			 * For filename longer than 15 bytes, GNU variant
			 * makes use of a string table and instead stores the
			 * offset of the real filename to in the ar_name field.
			 * The string table should have been written before.
			 */
			if (ar->has_strtab <= 0) {
				archive_set_error(&a->archive, EINVAL,
				    "Can't find string table");
				return (ARCHIVE_WARN);
			}

			se = (char *)malloc(strlen(filename) + 3);
			if (se == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate filename buffer");
				return (ARCHIVE_FATAL);
			}

			strncpy(se, filename, strlen(filename));
			strcpy(se + strlen(filename), "/\n");

			ss = strstr(ar->strtab, se);
			free(se);

			if (ss == NULL) {
				archive_set_error(&a->archive, EINVAL,
				    "Invalid string table");
				return (ARCHIVE_WARN);
			}

			/*
			 * GNU variant puts "/" followed by digits into
			 * ar_name field. These digits indicates the real
			 * filename string's offset to the string table.
			 */
			buff[AR_name_offset] = '/';
			if (format_decimal(ss - ar->strtab,
			    buff + AR_name_offset + 1,
			    AR_name_size - 1)) {
				archive_set_error(&a->archive, ERANGE,
				    "string table offset too large");
				return (ARCHIVE_WARN);
			}
		}
	} else if (a->archive.archive_format == ARCHIVE_FORMAT_AR_BSD) {
		/*
		 * BSD variant: for any file name which is more than
		 * 16 chars or contains one or more embedded space(s), the
		 * string "#1/" followed by the ASCII length of the name is
		 * put into the ar_name field. The file size (stored in the
		 * ar_size field) is incremented by the length of the name.
		 * The name is then written immediately following the
		 * archive header.
		 */
		if (strlen(filename) <= 16 && strchr(filename, ' ') == NULL) {
			strncpy(&buff[AR_name_offset], filename, strlen(filename));
			buff[AR_name_offset + strlen(filename)] = ' ';
		}
		else {
			strncpy(buff + AR_name_offset, "#1/", 3);
			if (format_decimal(strlen(filename),
			    buff + AR_name_offset + 3,
			    AR_name_size - 3)) {
				archive_set_error(&a->archive, ERANGE,
				    "File name too long");
				return (ARCHIVE_WARN);
			}
			append_fn = 1;
			size += strlen(filename);
		}
	}

stat:
	if (format_decimal(archive_entry_mtime(entry), buff + AR_date_offset, AR_date_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File modification time too large");
		return (ARCHIVE_WARN);
	}
	if (format_decimal(archive_entry_uid(entry), buff + AR_uid_offset, AR_uid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric user ID too large");
		return (ARCHIVE_WARN);
	}
	if (format_decimal(archive_entry_gid(entry), buff + AR_gid_offset, AR_gid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric group ID too large");
		return (ARCHIVE_WARN);
	}
	if (format_octal(archive_entry_mode(entry), buff + AR_mode_offset, AR_mode_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric mode too large");
		return (ARCHIVE_WARN);
	}
	/*
	 * Sanity Check: A non-pseudo archive member should always be
	 * a regular file.
	 */
	if (filename != NULL && archive_entry_filetype(entry) != AE_IFREG) {
		archive_set_error(&a->archive, EINVAL,
		    "Regular file required for non-pseudo member");
		return (ARCHIVE_WARN);
	}

size:
	if (format_decimal(size, buff + AR_size_offset, AR_size_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File size out of range");
		return (ARCHIVE_WARN);
	}

	ret = __archive_write_output(a, buff, 60);
	if (ret != ARCHIVE_OK)
		return (ret);

	ar->entry_bytes_remaining = size;
	ar->entry_padding = ar->entry_bytes_remaining % 2;

	if (append_fn > 0) {
		ret = __archive_write_output(a, filename, strlen(filename));
		if (ret != ARCHIVE_OK)
			return (ret);
		ar->entry_bytes_remaining -= strlen(filename);
	}

	return (ARCHIVE_OK);
}